

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceObjectByHandle
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE hHandleToReference,
          CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **ppobj)

{
  PAL_ERROR PVar1;
  DWORD *pdwRightsGranted;
  DWORD dwRightsGranted_00;
  DWORD local_44;
  IPalObject *pIStack_40;
  DWORD dwRightsGranted;
  IPalObject *pobj;
  
  pobj = (IPalObject *)ppobj;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x34e);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (paot == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x34f);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (pobj == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x350);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    pdwRightsGranted = &local_44;
    PVar1 = CSimpleHandleManager::GetObjectFromHandle
                      (&this->m_HandleManager,pthr,hHandleToReference,pdwRightsGranted,
                       &stack0xffffffffffffffc0);
    if (PVar1 == 0) {
      PVar1 = CheckObjectTypeAndRights(pIStack_40,paot,dwRightsGranted_00,(DWORD)pdwRightsGranted);
      if (PVar1 == 0) {
        pobj->_vptr_IPalObject = (_func_int **)pIStack_40;
      }
      else {
        (*pIStack_40->_vptr_IPalObject[8])(pIStack_40,pthr);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceObjectByHandle(
    CPalThread *pthr,
    HANDLE hHandleToReference,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError;
    DWORD dwRightsGranted;
    IPalObject *pobj;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::ReferenceObjectByHandle "
        "(this=%p, pthr=%p, hHandleToReference=%p, paot=%p, "
        "dwRightsRequired=%d, ppobj=%p)\n",
        this,
        pthr,
        hHandleToReference,
        paot,
        dwRightsRequired,
        ppobj
        );

    palError = m_HandleManager.GetObjectFromHandle(
        pthr,
        hHandleToReference,
        &dwRightsGranted,
        &pobj
        );

    if (NO_ERROR == palError)
    {
        palError = CheckObjectTypeAndRights(
            pobj,
            paot,
            dwRightsGranted,
            dwRightsRequired
            );

        if (NO_ERROR == palError)
        {
            //
            // Transfer object reference to out parameter
            //

            *ppobj = pobj;
        }
        else
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceObjectByHandle returns %d\n",
        palError
        );

    return palError;    
}